

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int docall(lua_State *L,int narg,int nres)

{
  int iVar1;
  int iVar2;
  int base;
  int status;
  int nres_local;
  int narg_local;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 - narg;
  lua_pushcclosure(L,msghandler,0);
  lua_rotate(L,iVar1,1);
  globalL = L;
  setsignal(2,laction);
  iVar2 = lua_pcallk(L,narg,nres,iVar1,0);
  setsignal(2,(_func_void_int *)0x0);
  lua_rotate(L,iVar1,0xffffffff);
  lua_settop(L,0xfffffffe);
  return iVar2;
}

Assistant:

static int docall (lua_State *L, int narg, int nres) {
  int status;
  int base = lua_gettop(L) - narg;  /* function index */
  lua_pushcfunction(L, msghandler);  /* push message handler */
  lua_insert(L, base);  /* put it under function and args */
  globalL = L;  /* to be available to 'laction' */
  setsignal(SIGINT, laction);  /* set C-signal handler */
  status = lua_pcall(L, narg, nres, base);
  setsignal(SIGINT, SIG_DFL); /* reset C-signal handler */
  lua_remove(L, base);  /* remove message handler from the stack */
  return status;
}